

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_typed_array_fill(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValueUnion JVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  JSValueUnion JVar6;
  int64_t iVar7;
  ulong uVar8;
  JSValue JVar9;
  JSValue JVar10;
  int32_t v;
  int final;
  int local_5c;
  JSValueUnion local_58;
  int local_4c;
  JSValueUnion local_48;
  JSValueUnion local_40;
  JSValueUnion local_38;
  
  iVar7 = this_val.tag;
  local_40 = this_val.u;
  iVar2 = js_typed_array_get_length_internal(ctx,this_val);
  JVar1 = local_40;
  if (-1 < iVar2) {
    if (*(ushort *)((long)local_40.ptr + 6) == 0x15) {
      local_58 = argv->u;
      JVar10 = *argv;
      if (0xfffffff4 < (uint)argv->tag) {
        *(int *)local_58.ptr = *local_58.ptr + 1;
      }
      iVar3 = JS_ToUint8ClampFree(ctx,&local_58.int32,JVar10);
      if (iVar3 == 0) {
        local_48 = (JSValueUnion)(long)local_58.int32;
        goto LAB_0016f021;
      }
    }
    else if (*(ushort *)((long)local_40.ptr + 6) < 0x1c) {
      local_58 = (JSValueUnion)(argv->u).ptr;
      JVar10 = *argv;
      if (0xfffffff4 < (uint)argv->tag) {
        *(int *)local_58.ptr = *local_58.ptr + 1;
      }
      iVar3 = JS_ToInt32Free(ctx,&local_58.int32,JVar10);
      if (iVar3 == 0) {
        local_48.float64 = local_58.float64 & 0xffffffff;
LAB_0016f021:
        local_38.float64 = JVar1.float64;
        local_5c = 0;
        if (((argc < 2) ||
            (iVar3 = JS_ToInt32Clamp(ctx,&local_5c,argv[1],0,iVar2,iVar2), iVar3 == 0)) &&
           ((local_4c = iVar2, argc < 3 ||
            (((int)argv[2].tag == 3 ||
             (JVar10.tag = argv[2].tag, JVar10.u.ptr = argv[2].u.ptr,
             iVar2 = JS_ToInt32Clamp(ctx,&local_4c,JVar10,0,iVar2,iVar2), iVar2 == 0)))))) {
          if (*(char *)(*(long *)(*(long *)(*(long *)((long)local_38.ptr + 0x30) + 0x18) + 0x30) + 4
                       ) == '\0') {
            switch("includes"[(ulong)*(ushort *)((long)local_38.ptr + 6) + 1]) {
            case '\0':
              if (local_5c < local_4c) {
                memset((void *)((long)local_5c + *(long *)((long)local_38.ptr + 0x38)),
                       local_48.int32,(long)(local_4c - local_5c));
              }
              break;
            case '\x01':
              if (local_5c < local_4c) {
                lVar4 = (long)local_5c;
                do {
                  *(short *)(*(long *)((long)local_38.ptr + 0x38) + lVar4 * 2) = local_48._0_2_;
                  lVar4 = lVar4 + 1;
                } while (local_4c != lVar4);
              }
              break;
            case '\x02':
              if (local_5c < local_4c) {
                lVar4 = (long)local_5c;
                do {
                  *(int32_t *)(*(long *)((long)local_38.ptr + 0x38) + lVar4 * 4) = local_48.int32;
                  lVar4 = lVar4 + 1;
                } while (local_4c != lVar4);
              }
              break;
            case '\x03':
              if (local_5c < local_4c) {
                lVar4 = (long)local_5c;
                do {
                  *(JSValueUnion *)(*(long *)((long)local_38.ptr + 0x38) + lVar4 * 8) = local_48;
                  lVar4 = lVar4 + 1;
                } while (local_4c != lVar4);
              }
              break;
            default:
              abort();
            }
            if (0xfffffff4 < (uint)this_val.tag) {
              *(int *)local_40.ptr = *local_40.ptr + 1;
            }
            uVar5 = (ulong)local_40.ptr & 0xffffffff00000000;
            uVar8 = (ulong)local_40.ptr & 0xffffffff;
            goto LAB_0016f009;
          }
          JS_ThrowTypeError(ctx,"ArrayBuffer is detached");
        }
      }
    }
    else {
      iVar3 = JS_ToFloat64(ctx,&local_58.float64,*argv);
      if ((iVar3 == 0) &&
         (JVar6._4_4_ = 0, JVar6.int32 = (int32_t)(float)local_58.float64, local_48 = local_58,
         *(short *)((long)JVar1.ptr + 6) == 0x1c)) {
        local_48 = JVar6;
      }
      if (iVar3 == 0) goto LAB_0016f021;
    }
  }
  uVar8 = 0;
  uVar5 = 0;
  iVar7 = 6;
LAB_0016f009:
  JVar9.tag = iVar7;
  JVar9.u.ptr = (void *)(uVar8 | uVar5);
  return JVar9;
}

Assistant:

static JSValue js_typed_array_fill(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv)
{
    JSObject *p;
    int len, k, final, shift;
    uint64_t v64;

    len = js_typed_array_get_length_internal(ctx, this_val);
    if (len < 0)
        return JS_EXCEPTION;
    p = JS_VALUE_GET_OBJ(this_val);

    if (p->class_id == JS_CLASS_UINT8C_ARRAY) {
        int32_t v;
        if (JS_ToUint8ClampFree(ctx, &v, JS_DupValue(ctx, argv[0])))
            return JS_EXCEPTION;
        v64 = v;
    } else if (p->class_id <= JS_CLASS_UINT32_ARRAY) {
        uint32_t v;
        if (JS_ToUint32(ctx, &v, argv[0]))
            return JS_EXCEPTION;
        v64 = v;
    } else
#ifdef CONFIG_BIGNUM
    if (p->class_id <= JS_CLASS_BIG_UINT64_ARRAY) {
        if (JS_ToBigInt64(ctx, (int64_t *)&v64, argv[0]))
            return JS_EXCEPTION;
    } else
#endif
    {
        double d;
        if (JS_ToFloat64(ctx, &d, argv[0]))
            return JS_EXCEPTION;
        if (p->class_id == JS_CLASS_FLOAT32_ARRAY) {
            union {
                float f;
                uint32_t u32;
            } u;
            u.f = d;
            v64 = u.u32;
        } else {
            JSFloat64Union u;
            u.d = d;
            v64 = u.u64;
        }
    }

    k = 0;
    if (argc > 1) {
        if (JS_ToInt32Clamp(ctx, &k, argv[1], 0, len, len))
            return JS_EXCEPTION;
    }

    final = len;
    if (argc > 2 && !JS_IsUndefined(argv[2])) {
        if (JS_ToInt32Clamp(ctx, &final, argv[2], 0, len, len))
            return JS_EXCEPTION;
    }

    if (typed_array_is_detached(ctx, p))
        return JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
    
    shift = typed_array_size_log2(p->class_id);
    switch(shift) {
    case 0:
        if (k < final) {
            memset(p->u.array.u.uint8_ptr + k, v64, final - k);
        }
        break;
    case 1:
        for(; k < final; k++) {
            p->u.array.u.uint16_ptr[k] = v64;
        }
        break;
    case 2:
        for(; k < final; k++) {
            p->u.array.u.uint32_ptr[k] = v64;
        }
        break;
    case 3:
        for(; k < final; k++) {
            p->u.array.u.uint64_ptr[k] = v64;
        }
        break;
    default:
        abort();
    }
    return JS_DupValue(ctx, this_val);
}